

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_pubnonce_load
              (secp256k1_context *ctx,secp256k1_ge *ges,secp256k1_musig_pubnonce *nonce)

{
  long lVar1;
  int iVar2;
  secp256k1_ge_storage local_68;
  
  lVar1 = 0;
  do {
    iVar2 = (uint)nonce->data[lVar1] - (uint)secp256k1_musig_pubnonce_magic[lVar1];
    if (nonce->data[lVar1] != secp256k1_musig_pubnonce_magic[lVar1]) goto LAB_00110e6c;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  iVar2 = 0;
LAB_00110e6c:
  if (iVar2 == 0) {
    lVar1 = 0;
    do {
      local_68.x.n[0] = *(uint64_t *)(nonce->data + lVar1 + 4);
      local_68.x.n[1] = *(uint64_t *)(nonce->data + lVar1 + 4 + 8);
      local_68.x.n[2] = *(uint64_t *)(nonce->data + lVar1 + 0x14);
      local_68.x.n[3] = *(uint64_t *)(nonce->data + lVar1 + 0x14 + 8);
      local_68.y.n[0] = *(uint64_t *)(nonce->data + lVar1 + 0x24);
      local_68.y.n[1] = *(uint64_t *)(nonce->data + lVar1 + 0x24 + 8);
      local_68.y.n[2] = *(uint64_t *)(nonce->data + lVar1 + 0x34);
      local_68.y.n[3] = *(uint64_t *)(nonce->data + lVar1 + 0x34 + 8);
      secp256k1_ge_from_storage(ges,&local_68);
      lVar1 = lVar1 + 0x40;
      ges = ges + 1;
    } while (lVar1 == 0x40);
    iVar2 = 1;
  }
  else {
    secp256k1_musig_pubnonce_load_cold_1();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int secp256k1_musig_pubnonce_load(const secp256k1_context* ctx, secp256k1_ge* ges, const secp256k1_musig_pubnonce* nonce) {
    int i;

    ARG_CHECK(secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_pubnonce_magic, 4) == 0);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_from_bytes(&ges[i], nonce->data + 4 + 64*i);
    }
    return 1;
}